

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O1

REF_STATUS ref_meshlink_infer_orientation(REF_GRID ref_grid)

{
  REF_MPI ref_mpi;
  REF_CELL ref_cell;
  REF_GEOM pRVar1;
  bool bVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  long lVar5;
  ulong uVar6;
  REF_STATUS RVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  REF_DBL max_normdev;
  REF_DBL min_normdev;
  REF_INT positive;
  REF_INT negative;
  REF_INT max_id;
  REF_DBL normdev;
  REF_INT min_id;
  REF_INT nodes [27];
  double local_e8;
  double local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  double local_c8;
  int local_bc;
  REF_GEOM local_b8;
  REF_GRID local_b0;
  REF_INT local_a8 [30];
  
  ref_mpi = ref_grid->mpi;
  ref_cell = ref_grid->cell[3];
  pRVar1 = ref_grid->geom;
  uVar3 = ref_cell_id_range(ref_cell,ref_mpi,&local_bc,&local_cc);
  iVar8 = local_cc;
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
           0x3c6,"ref_meshlink_infer_orientation",(ulong)uVar3,"id range");
    return uVar3;
  }
  if (local_bc < 1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
           0x3c7,"ref_meshlink_infer_orientation","expected min_id greater then zero");
    return 1;
  }
  lVar10 = (long)local_cc;
  pRVar1->nface = local_cc;
  local_b8 = pRVar1;
  local_b0 = ref_grid;
  if (lVar10 < 0) {
    RVar7 = 1;
    pcVar9 = "malloc ref_geom->uv_area_sign of REF_DBL negative";
  }
  else {
    pRVar4 = (REF_DBL *)malloc(lVar10 * 8);
    pRVar1->uv_area_sign = pRVar4;
    if (pRVar4 != (REF_DBL *)0x0) {
      bVar2 = true;
      RVar7 = 0;
      if (iVar8 != 0) {
        lVar5 = 0;
        do {
          pRVar4[lVar5] = 1.0;
          lVar5 = lVar5 + 1;
        } while (lVar10 != lVar5);
      }
      goto LAB_001bab38;
    }
    RVar7 = 2;
    pcVar9 = "malloc ref_geom->uv_area_sign of REF_DBL NULL";
  }
  bVar2 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",0x3c9,
         "ref_meshlink_infer_orientation",pcVar9);
LAB_001bab38:
  if (bVar2) {
    RVar7 = 0;
    if (local_bc <= local_cc) {
      uVar6 = (long)local_bc;
      do {
        local_e0 = 2.0;
        local_e8 = -2.0;
        local_d0 = 0;
        local_d4 = 0;
        if (0 < ref_cell->max) {
          iVar8 = 0;
          do {
            RVar7 = ref_cell_nodes(ref_cell,iVar8,local_a8);
            if ((RVar7 == 0) && (local_a8[ref_cell->node_per] == (int)uVar6)) {
              uVar3 = ref_geom_tri_norm_deviation(local_b0,local_a8,&local_c8);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                       ,0x3d2,"ref_meshlink_infer_orientation",(ulong)uVar3,"norm dev");
                return uVar3;
              }
              if (local_c8 <= local_e0) {
                local_e0 = local_c8;
              }
              if (local_e8 <= local_c8) {
                local_e8 = local_c8;
              }
              if (0.0 <= local_c8) {
                local_d4 = local_d4 + 1;
              }
              else {
                local_d0 = local_d0 + 1;
              }
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < ref_cell->max);
        }
        local_c8 = local_e0;
        uVar3 = ref_mpi_min(ref_mpi,&local_c8,&local_e0,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x3dc,"ref_meshlink_infer_orientation",(ulong)uVar3,"mpi max");
          return uVar3;
        }
        uVar3 = ref_mpi_bcast(ref_mpi,&local_e0,1,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x3dd,"ref_meshlink_infer_orientation",(ulong)uVar3,"min");
          return uVar3;
        }
        local_c8 = local_e8;
        uVar3 = ref_mpi_max(ref_mpi,&local_c8,&local_e8,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x3df,"ref_meshlink_infer_orientation",(ulong)uVar3,"mpi max");
          return uVar3;
        }
        uVar3 = ref_mpi_bcast(ref_mpi,&local_e8,1,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x3e0,"ref_meshlink_infer_orientation",(ulong)uVar3,"max");
          return uVar3;
        }
        uVar3 = ref_mpi_allsum(ref_mpi,&local_d4,1,1);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x3e1,"ref_meshlink_infer_orientation",(ulong)uVar3,"mpi sum");
          return uVar3;
        }
        uVar3 = ref_mpi_allsum(ref_mpi,&local_d0,1,1);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x3e2,"ref_meshlink_infer_orientation",(ulong)uVar3,"mpi sum");
          return uVar3;
        }
        if ((local_e0 <= 1.5) || (-1.5 <= local_e8)) {
          if (local_d4 < local_d0) {
            local_b8->uv_area_sign[uVar6 - 1] = -1.0;
          }
          if (ref_mpi->id == 0) {
            printf("gref %3d orientation%6.2f inferred from %6.2f %d %d %6.2f \n",
                   local_b8->uv_area_sign[uVar6 - 1],local_e0,local_e8,uVar6 & 0xffffffff);
          }
        }
        else {
          local_b8->uv_area_sign[uVar6 - 1] = 0.0;
        }
        RVar7 = 0;
        bVar2 = (long)uVar6 < (long)local_cc;
        uVar6 = uVar6 + 1;
      } while (bVar2);
    }
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_infer_orientation(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT min_id, max_id, id;
  REF_DBL normdev, min_normdev, max_normdev;
  REF_INT negative, positive;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  RSS(ref_cell_id_range(ref_cell, ref_mpi, &min_id, &max_id), "id range");
  RAS(min_id > 0, "expected min_id greater then zero");
  ref_geom->nface = max_id;
  ref_malloc_init(ref_geom->uv_area_sign, ref_geom->nface, REF_DBL, 1.0);

  for (id = min_id; id <= max_id; id++) {
    min_normdev = 2.0;
    max_normdev = -2.0;
    negative = 0;
    positive = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
      max_normdev = MAX(max_normdev, normdev);
      if (normdev < 0.0) {
        negative++;
      } else {
        positive++;
      }
    }
    normdev = min_normdev;
    RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");
    normdev = max_normdev;
    RSS(ref_mpi_max(ref_mpi, &normdev, &max_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_normdev, 1, REF_DBL_TYPE), "max");
    RSS(ref_mpi_allsum(ref_mpi, &positive, 1, REF_INT_TYPE), "mpi sum");
    RSS(ref_mpi_allsum(ref_mpi, &negative, 1, REF_INT_TYPE), "mpi sum");
    if (min_normdev > 1.5 && max_normdev < -1.5) {
      ref_geom->uv_area_sign[id - 1] = 0.0;
    } else {
      if (positive < negative) ref_geom->uv_area_sign[id - 1] = -1.0;
      if (ref_mpi_once(ref_mpi))
        printf("gref %3d orientation%6.2f inferred from %6.2f %d %d %6.2f \n",
               id, ref_geom->uv_area_sign[id - 1], min_normdev, negative,
               positive, max_normdev);
    }
  }

  return REF_SUCCESS;
}